

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void __thiscall
kj::(anonymous_namespace)::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  anon_unknown_9::DiskAppendableFile::~DiskAppendableFile((DiskAppendableFile *)(this + -0x18));
  return;
}

Assistant:

DiskAppendableFile(OwnFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}